

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

char * __thiscall
google::protobuf::EnumDescriptorProto_EnumReservedRange::_InternalParse
          (EnumDescriptorProto_EnumReservedRange *this,char *ptr,ParseContext *ctx)

{
  bool bVar1;
  uint32_t uVar2;
  UnknownFieldSet *unknown;
  ulong tag_00;
  uint uVar3;
  uint32_t tag;
  char *local_48;
  uint local_3c;
  InternalMetadata *local_38;
  
  local_38 = &(this->super_Message).super_MessageLite._internal_metadata_;
  uVar3 = 0;
  local_48 = ptr;
  do {
    while( true ) {
      bVar1 = internal::ParseContext::Done(ctx,&local_48);
      if (bVar1) goto LAB_0037a767;
      local_48 = internal::ReadTag(local_48,&local_3c,0);
      tag_00 = (ulong)local_3c;
      if (local_3c >> 3 == 2) break;
      if ((local_3c >> 3 != 1) || ((char)local_3c != '\b')) goto LAB_0037a71a;
      uVar3 = uVar3 | 1;
      uVar2 = internal::ReadVarint32(&local_48);
      this->start_ = uVar2;
LAB_0037a711:
      if (local_48 == (char *)0x0) goto LAB_0037a752;
    }
    if ((char)local_3c == '\x10') {
      uVar3 = uVar3 | 2;
      uVar2 = internal::ReadVarint32(&local_48);
      this->end_ = uVar2;
      goto LAB_0037a711;
    }
LAB_0037a71a:
    if ((tag_00 == 0) || ((local_3c & 7) == 4)) {
      if (local_48 != (char *)0x0) {
        (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = local_3c - 1;
        goto LAB_0037a767;
      }
      break;
    }
    unknown = internal::InternalMetadata::mutable_unknown_fields<google::protobuf::UnknownFieldSet>
                        (local_38);
    local_48 = internal::UnknownFieldParse(tag_00,unknown,local_48,ctx);
  } while (local_48 != (char *)0x0);
LAB_0037a752:
  local_48 = (char *)0x0;
LAB_0037a767:
  (this->_has_bits_).has_bits_[0] = (this->_has_bits_).has_bits_[0] | uVar3;
  return local_48;
}

Assistant:

const char* EnumDescriptorProto_EnumReservedRange::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  _Internal::HasBits has_bits{};
  while (!ctx->Done(&ptr)) {
    uint32_t tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    switch (tag >> 3) {
      // optional int32 start = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 8)) {
          _Internal::set_has_start(&has_bits);
          start_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint32(&ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // optional int32 end = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 16)) {
          _Internal::set_has_end(&has_bits);
          end_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint32(&ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      default:
        goto handle_unusual;
    }  // switch
  handle_unusual:
    if ((tag == 0) || ((tag & 7) == 4)) {
      CHK_(ptr);
      ctx->SetLastTag(tag);
      goto message_done;
    }
    ptr = UnknownFieldParse(
        tag,
        _internal_metadata_.mutable_unknown_fields<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(),
        ptr, ctx);
    CHK_(ptr != nullptr);
  }  // while
message_done:
  _has_bits_.Or(has_bits);
  return ptr;
failure:
  ptr = nullptr;
  goto message_done;
#undef CHK_
}